

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

int64_t tune_base_thresh_content
                  (AV1_COMP *cpi,int64_t threshold_base,int content_lowsumdiff,int source_sad_nonrd,
                  int num_pixels)

{
  NOISE_LEVEL NVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  NOISE_LEVEL noise_level;
  int64_t updated_thresh_base;
  AV1_COMMON *cm;
  int64_t local_30;
  
  local_30 = in_RSI;
  if (((((int)in_RDI[0x13a9c] != 0) && (in_EDX != 0)) && (0x4b000 < in_R8D)) &&
     (0x3c < *(uint *)(in_RDI + 0x77f2))) {
    NVar1 = av1_noise_estimate_extract_level((NOISE_ESTIMATE *)(in_RDI + 0x13a9c));
    if (NVar1 == kHigh) {
      local_30 = in_RSI * 5 >> 1;
    }
    else if ((NVar1 == kMedium) && (*(int *)((long)in_RDI + 0x60cfc) == 0)) {
      local_30 = in_RSI * 5 >> 2;
    }
  }
  local_30 = scale_part_thresh_content
                       (local_30,*(int *)((long)in_RDI + 0x4272c),*(int *)(*in_RDI + 0x14dc4),
                        (uint)(in_RDI[0xc0f9] == 0));
  if (((10 < *(int *)((long)in_RDI + 0x4272c)) && (2 < in_ECX)) &&
     (*(int *)((long)in_RDI + 0x607b4) != 0)) {
    local_30 = local_30 << 4;
  }
  return local_30;
}

Assistant:

static inline int64_t tune_base_thresh_content(AV1_COMP *cpi,
                                               int64_t threshold_base,
                                               int content_lowsumdiff,
                                               int source_sad_nonrd,
                                               int num_pixels) {
  AV1_COMMON *const cm = &cpi->common;
  int64_t updated_thresh_base = threshold_base;
  if (cpi->noise_estimate.enabled && content_lowsumdiff &&
      num_pixels > RESOLUTION_480P && cm->current_frame.frame_number > 60) {
    NOISE_LEVEL noise_level =
        av1_noise_estimate_extract_level(&cpi->noise_estimate);
    if (noise_level == kHigh)
      updated_thresh_base = (5 * updated_thresh_base) >> 1;
    else if (noise_level == kMedium &&
             !cpi->sf.rt_sf.prefer_large_partition_blocks)
      updated_thresh_base = (5 * updated_thresh_base) >> 2;
  }
  updated_thresh_base = scale_part_thresh_content(
      updated_thresh_base, cpi->oxcf.speed,
      cpi->ppi->rtc_ref.non_reference_frame, cpi->rc.frame_source_sad == 0);
  if (cpi->oxcf.speed >= 11 && source_sad_nonrd > kLowSad &&
      cpi->rc.high_motion_content_screen_rtc)
    updated_thresh_base = updated_thresh_base << 4;
  return updated_thresh_base;
}